

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_writer_validate_archive_name(char *pArchive_name)

{
  char *local_18;
  char *pArchive_name_local;
  
  local_18 = pArchive_name;
  if (*pArchive_name == '/') {
    pArchive_name_local._4_4_ = 0;
  }
  else {
    for (; *local_18 != '\0'; local_18 = local_18 + 1) {
      if ((*local_18 == '\\') || (*local_18 == ':')) {
        return 0;
      }
    }
    pArchive_name_local._4_4_ = 1;
  }
  return pArchive_name_local._4_4_;
}

Assistant:

static mz_bool mz_zip_writer_validate_archive_name(const char *pArchive_name) {
  // Basic ZIP archive filename validity checks: Valid filenames cannot start
  // with a forward slash, cannot contain a drive letter, and cannot use
  // DOS-style backward slashes.
  if (*pArchive_name == '/')
    return MZ_FALSE;
  while (*pArchive_name) {
    if ((*pArchive_name == '\\') || (*pArchive_name == ':'))
      return MZ_FALSE;
    pArchive_name++;
  }
  return MZ_TRUE;
}